

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qresource.cpp
# Opt level: O0

bool QResource::registerResource(QString *rccFilename,QString *resourceRoot)

{
  long lVar1;
  bool bVar2;
  ushort *puVar3;
  ushort *puVar4;
  long *plVar5;
  QString *in_RSI;
  QString *in_RDI;
  long in_FS_OFFSET;
  QDynamicFileResourceRoot *root;
  scoped_lock<QRecursiveMutex> locker;
  QString r;
  parameter_type in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffef0;
  int in_stack_fffffffffffffef4;
  undefined7 in_stack_fffffffffffffef8;
  undefined1 in_stack_fffffffffffffeff;
  QMessageLogger *in_stack_ffffffffffffff00;
  bool local_a9;
  undefined4 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  QDynamicFileResourceRoot *in_stack_ffffffffffffff70;
  bool local_71;
  QMessageLogger local_68;
  QChar local_42 [13];
  undefined1 *local_28;
  undefined1 *puStack_20;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_28 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_20 = &DAT_aaaaaaaaaaaaaaaa;
  QString::QString((QString *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                   (QString *)in_stack_fffffffffffffee8);
  qt_resource_fixResourceRoot
            ((QString *)CONCAT17(in_stack_fffffffffffffeff,in_stack_fffffffffffffef8));
  QString::~QString((QString *)0x2e84c8);
  bVar2 = QString::isEmpty((QString *)0x2e84d5);
  local_a9 = false;
  if (!bVar2) {
    QString::operator[]((QString *)in_stack_fffffffffffffee8,0x2e84f3);
    QChar::QChar<char16_t,_true>(local_42,L'/');
    local_a9 = ::operator!=((QChar *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                            (QChar *)in_stack_fffffffffffffee8);
  }
  if (local_a9 == false) {
    plVar5 = (long *)operator_new(0x70);
    anon_unknown.dwarf_3b8fd3::QDynamicFileResourceRoot::QDynamicFileResourceRoot
              ((QDynamicFileResourceRoot *)
               CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
               (QString *)in_stack_fffffffffffffee8);
    bVar2 = anon_unknown.dwarf_3b8fd3::QDynamicFileResourceRoot::registerSelf
                      (in_stack_ffffffffffffff70,
                       (QString *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    if (bVar2) {
      QBasicAtomicInteger<int>::ref
                ((QBasicAtomicInteger<int> *)
                 CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
      resourceMutex();
      (anonymous_namespace)::qt_scoped_lock<QRecursiveMutex,std::scoped_lock<QRecursiveMutex>>
                ((QRecursiveMutex *)in_stack_fffffffffffffee8);
      resourceList();
      QList<(anonymous_namespace)::QResourceRoot_*>::append
                ((QList<(anonymous_namespace)::QResourceRoot_*> *)0x2e86bf,in_stack_fffffffffffffee8
                );
      local_71 = true;
      std::scoped_lock<QRecursiveMutex>::~scoped_lock((scoped_lock<QRecursiveMutex> *)0x2e86e1);
    }
    else {
      if (plVar5 != (long *)0x0) {
        (**(code **)(*plVar5 + 8))();
      }
      local_71 = false;
    }
  }
  else {
    QMessageLogger::QMessageLogger
              (in_stack_ffffffffffffff00,
               (char *)CONCAT17(in_stack_fffffffffffffeff,in_stack_fffffffffffffef8),
               in_stack_fffffffffffffef4,(char *)in_stack_fffffffffffffee8);
    QtPrivate::asString(in_RDI);
    puVar3 = QString::utf16((QString *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0)
                           );
    QtPrivate::asString(in_RSI);
    puVar4 = QString::utf16((QString *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0)
                           );
    QMessageLogger::warning
              (&local_68,
               "QDir::registerResource: Registering a resource [%ls] must be rooted in an absolute path (start with /) [%ls]"
               ,puVar3,puVar4);
    local_71 = false;
  }
  QString::~QString((QString *)0x2e8774);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_71;
  }
  __stack_chk_fail();
}

Assistant:

bool QResource::registerResource(const QString &rccFilename, const QString &resourceRoot)
{
    QString r = qt_resource_fixResourceRoot(resourceRoot);
    if (!r.isEmpty() && r[0] != u'/') {
        qWarning("QDir::registerResource: Registering a resource [%ls] must be rooted in an "
                 "absolute path (start with /) [%ls]",
                 qUtf16Printable(rccFilename), qUtf16Printable(resourceRoot));
        return false;
    }

    QDynamicFileResourceRoot *root = new QDynamicFileResourceRoot(r);
    if (root->registerSelf(rccFilename)) {
        root->ref.ref();
        const auto locker = qt_scoped_lock(resourceMutex());
        resourceList()->append(root);
        return true;
    }
    delete root;
    return false;
}